

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalArrowCollector::GetGlobalSinkState
          (PhysicalArrowCollector *this,ClientContext *context)

{
  __uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_> in_RDI;
  unique_ptr<duckdb::ArrowCollectorGlobalState,_std::default_delete<duckdb::ArrowCollectorGlobalState>_>
  *in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_> this_00;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  make_uniq<duckdb::ArrowCollectorGlobalState>();
  unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>,true>::
  unique_ptr<duckdb::ArrowCollectorGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalSinkState,std::default_delete<duckdb::GlobalSinkState>>>,void>
            ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
                .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl,
             in_stack_ffffffffffffffc8);
  unique_ptr<duckdb::ArrowCollectorGlobalState,_std::default_delete<duckdb::ArrowCollectorGlobalState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ArrowCollectorGlobalState,_std::default_delete<duckdb::ArrowCollectorGlobalState>,_true>
                 *)0x152a073);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
         )in_RDI._M_t.
          super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
          .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalArrowCollector::GetGlobalSinkState(ClientContext &context) const {
	return make_uniq<ArrowCollectorGlobalState>();
}